

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_read_plt_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  opj_event_mgr_t *in_RCX;
  int in_EDX;
  OPJ_BYTE *in_RSI;
  OPJ_UINT32 i;
  OPJ_UINT32 l_packet_len;
  OPJ_UINT32 l_tmp;
  OPJ_UINT32 l_Zplt;
  uint local_38;
  uint local_34;
  uint local_30;
  OPJ_UINT32 local_2c;
  opj_event_mgr_t *local_28;
  uint local_1c;
  OPJ_BYTE *local_18;
  opj_bool local_4;
  
  local_34 = 0;
  if (in_EDX == 0) {
    opj_event_msg_v2(in_RCX,1,"Error reading PLM marker\n");
    local_4 = 0;
  }
  else {
    local_28 = in_RCX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    opj_read_bytes_LE(in_RSI,&local_2c,1);
    local_1c = local_1c - 1;
    for (local_38 = 0; local_18 = local_18 + 1, local_38 < local_1c; local_38 = local_38 + 1) {
      opj_read_bytes_LE(local_18,&local_30,1);
      if ((local_30 & 0x80) == 0) {
        local_34 = 0;
      }
      else {
        local_34 = (local_30 & 0x7f | local_34) << 7;
      }
    }
    if (local_34 == 0) {
      local_4 = 1;
    }
    else {
      opj_event_msg_v2(local_28,1,"Error reading PLM marker\n");
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

opj_bool j2k_read_plt_v2 (
						opj_j2k_v2_t *p_j2k,
						OPJ_BYTE * p_header_data,
						OPJ_UINT32 p_header_size,
						struct opj_event_mgr * p_manager
					)
{
	OPJ_UINT32 l_Zplt, l_tmp, l_packet_len = 0, i;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	if (p_header_size < 1) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading PLM marker\n");
		return OPJ_FALSE;
	}

	opj_read_bytes(p_header_data,&l_Zplt,1);		/* Zplt */
	++p_header_data;
	--p_header_size;

	for (i = 0; i < p_header_size; ++i) {
		opj_read_bytes(p_header_data,&l_tmp,1);		/* Iplt_ij */
		++p_header_data;
		/* take only the last seven bytes */
		l_packet_len |= (l_tmp & 0x7f);
		if (l_tmp & 0x80) {
			l_packet_len <<= 7;
		}
		else {
            /* store packet length and proceed to next packet */
			l_packet_len = 0;
		}
	}

	if (l_packet_len != 0) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading PLM marker\n");
		return OPJ_FALSE;
	}

	return OPJ_TRUE;
}